

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLStream.cpp
# Opt level: O3

ssize_t __thiscall
ODDLParser::IOStreamBase::write(IOStreamBase *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  undefined4 in_register_00000034;
  string formatStatement;
  long *local_30;
  size_t local_28;
  long local_20 [2];
  
  if (this->m_file == (FILE *)0x0) {
    sVar1 = 0;
  }
  else {
    (*this->m_formatter->_vptr_StreamFormatterBase[2])
              (&local_30,this->m_formatter,CONCAT44(in_register_00000034,__fd));
    sVar1 = fwrite(local_30,1,local_28,(FILE *)this->m_file);
    if (local_30 != local_20) {
      operator_delete(local_30,local_20[0] + 1);
    }
  }
  return sVar1;
}

Assistant:

size_t IOStreamBase::write(const std::string &statement) {
    if (ddl_nullptr == m_file) {
        return 0;
    }
    std::string formatStatement = m_formatter->format(statement);
    return ::fwrite(formatStatement.c_str(), sizeof(char), formatStatement.size(), m_file);
}